

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O1

void __thiscall w3Module::read_types(w3Module *this,uint8_t **cursor)

{
  pointer pwVar1;
  byte bVar2;
  uint32_t uVar3;
  long lVar4;
  string local_50;
  
  printf("read_types1 offset:%lX\n",(long)*cursor - (long)this->base);
  uVar3 = ::read_varuint32(cursor,this->end);
  std::vector<w3FunctionType,_std::allocator<w3FunctionType>_>::resize
            (&this->function_types,(ulong)uVar3);
  if (uVar3 != 0) {
    lVar4 = 0;
    do {
      printf("read_types2 before marker offset:%lX\n",(long)*cursor - (long)this->base);
      bVar2 = ::read_byte(cursor,this->end);
      printf("read_types3 marker:%X offset:%lX\n",(ulong)bVar2,(long)*cursor - (long)this->base);
      if (bVar2 != 0x60) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"malformed2 in Types::read","");
        ThrowString(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      pwVar1 = (this->function_types).
               super__Vector_base<w3FunctionType,_std::allocator<w3FunctionType>_>._M_impl.
               super__Vector_impl_data._M_start;
      read_vector_ValueType
                (this,(vector<w3Tag,_std::allocator<w3Tag>_> *)
                      ((long)&(pwVar1->parameters).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>
                              ._M_impl + lVar4),cursor);
      read_vector_ValueType
                (this,(vector<w3Tag,_std::allocator<w3Tag>_> *)
                      ((long)&(pwVar1->results).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>.
                              _M_impl + lVar4),cursor);
      lVar4 = lVar4 + 0x30;
    } while ((ulong)uVar3 * 0x30 != lVar4);
  }
  puts("read section 1");
  return;
}

Assistant:

void w3Module::read_types (uint8_t** cursor)
{
    printf ("read_types1 offset:%" FORMAT_SIZE "X\n", (long_t)(*cursor - this->base));
    const size_t size = read_varuint32 (cursor);
    function_types.resize (size);
    for (size_t i = 0; i < size; ++i)
    {
        printf ("read_types2 before marker offset:%" FORMAT_SIZE "X\n", (long_t)(*cursor - this->base));
        const uint32_t marker = read_byte (cursor);
        printf ("read_types3 marker:%X offset:%" FORMAT_SIZE "X\n", marker, (long_t)(*cursor - this->base));
        if (marker != 0x60)
            ThrowString ("malformed2 in Types::read");
        read_function_type (function_types [i], cursor);
    }
    printf ("read section 1\n");
}